

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_OW.cpp
# Opt level: O2

int __thiscall
TRootHandler_OW::Load
          (TRootHandler_OW *this,TCascStorage *hs,CASC_CSV *Csv,void *pvTextFile,
          size_t nFileNameIndex,size_t nCKeyIndex)

{
  int iVar1;
  size_t sVar2;
  CONTENT_KEY CKey;
  char szFileName [1025];
  
  while( true ) {
    sVar2 = CASC_CSV::LoadNextLine(Csv,pvTextFile);
    if (sVar2 == 0) break;
    iVar1 = CASC_CSV::GetString(Csv,szFileName,0x400,nFileNameIndex);
    if (iVar1 == 0) {
      iVar1 = CASC_CSV::GetBinary(Csv,CKey.Value,0x10,nCKeyIndex);
      if (iVar1 == 0) {
        CASC_FILE_TREE::Insert
                  (&(this->super_TFileTreeRoot).FileTree,&CKey,szFileName,0xffffffff,0xffffffff,
                   0xffffffff);
      }
    }
  }
  return 0;
}

Assistant:

int Load(TCascStorage * hs, CASC_CSV & Csv, void * pvTextFile, size_t nFileNameIndex, size_t nCKeyIndex)
    {
        CONTENT_KEY CKey;
        char szFileName[MAX_PATH+1];
//      size_t ApmFiles[0x80];
//      size_t nApmFiles = 0;

        CASCLIB_UNUSED(hs);

        // Keep loading every line until there is something
        while(Csv.LoadNextLine(pvTextFile) != 0)
        {
            // Retrieve the file name and the content key
            if(Csv.GetString(szFileName, MAX_PATH, nFileNameIndex) == ERROR_SUCCESS && Csv.GetBinary(CKey.Value, MD5_HASH_SIZE, nCKeyIndex) == ERROR_SUCCESS)
            {
                // Insert the file name and the CKey into the tree
                FileTree.Insert(&CKey, szFileName);

                // If the file name is actually an asset, we need to parse that asset and load files in it
//              if(IsApmFileName(szFileName))
//              {
//                  ApmFiles[nApmFiles++] = FileTree_IndexOf(&pRootHandler->FileTree, pFileNode1);
//              }
            }
        }
/*
        // Load all CMF+APM files
        if(nError == ERROR_SUCCESS)
        {
            for(size_t i = 0; i < nApmFiles; i++)
            {
                char szApmFile[MAX_PATH + 1];
                char szCmfFile[MAX_PATH + 1];

                // Get the n-th item and its name
                pFileNode1 = (PCASC_FILE_NODE)FileTree_PathAt(&pRootHandler->FileTree, szApmFile, MAX_PATH, ApmFiles[i]);
                if(pFileNode1 == NULL)
                    break;

                if(strcmp(szApmFile, "TactManifest\\Win_SPWin_RDEV_LenUS_EExt.apm"))
                    continue;

                // Get the name of thew CMF file
                strcpy(szCmfFile, szApmFile);
                strcpy((char *)GetFileExtension(szCmfFile), ".cmf");
                pFileNode2 = (PCASC_FILE_NODE)FileTree_Find(&pRootHandler->FileTree, szCmfFile);
                if(pFileNode2 == NULL)
                    break;

                // Create the map of CMF entries
                nError = LoadCmfFile(hs, pFileNode2->CKey, szCmfFile);
                if(nError != ERROR_SUCCESS)
                    break;

            }
        }
*/
        return ERROR_SUCCESS;
    }